

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

int Wlc_NtkCexResim(Gia_Man_t *pAbs,Abc_Cex_t *p,Vec_Int_t *vFirstTotal,int iBit,Vec_Wrd_t *vRes,
                   int iFrame)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  word Entry;
  int iVar5;
  ulong uVar6;
  
  iVar5 = 0;
  while ((iVar1 = iBit + iVar5, iVar5 < pAbs->vCis->nSize - pAbs->nRegs &&
         (pGVar3 = Gia_ManCi(pAbs,iVar5), pGVar3 != (Gia_Obj_t *)0x0))) {
    *(ulong *)pGVar3 =
         *(ulong *)pGVar3 & 0xffffffffbfffffff |
         (ulong)(((uint)(&p[1].iPo)[iVar1 >> 5] >> ((byte)iVar1 & 0x1f) & 1) << 0x1e);
    iVar5 = iVar5 + 1;
  }
  iVar5 = 0;
  while ((iVar5 < pAbs->nObjs && (pGVar3 = Gia_ManObj(pAbs,iVar5), pGVar3 != (Gia_Obj_t *)0x0))) {
    uVar6 = *(ulong *)pGVar3;
    if ((uVar6 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar6) {
      uVar2 = (uint)(uVar6 >> 0x20);
      *(ulong *)pGVar3 =
           uVar6 & 0xffffffff3fffffff |
           (ulong)(((uVar2 >> 0x1d ^ *(uint *)(pGVar3 + -(ulong)(uVar2 & 0x1fffffff)) >> 0x1e) &
                    ((uint)(uVar6 >> 0x1d) & 7 ^ *(uint *)(pGVar3 + -(uVar6 & 0x1fffffff)) >> 0x1e)
                   & 1) << 0x1e);
    }
    iVar5 = iVar5 + 1;
  }
  iVar5 = 0;
  while ((iVar5 < pAbs->vCos->nSize && (pGVar3 = Gia_ManCo(pAbs,iVar5), pGVar3 != (Gia_Obj_t *)0x0))
        ) {
    uVar2 = (uint)*(ulong *)pGVar3;
    *(ulong *)pGVar3 =
         *(ulong *)pGVar3 & 0xffffffffbfffffff |
         (ulong)((uVar2 * 2 ^ *(uint *)(pGVar3 + -(ulong)(uVar2 & 0x1fffffff))) & 0x40000000);
    iVar5 = iVar5 + 1;
  }
  iVar5 = 0;
  while (((iVar5 < pAbs->nRegs &&
          (pGVar3 = Gia_ManCo(pAbs,(pAbs->vCos->nSize - pAbs->nRegs) + iVar5),
          pGVar3 != (Gia_Obj_t *)0x0)) &&
         (pGVar4 = Gia_ManCi(pAbs,(pAbs->vCis->nSize - pAbs->nRegs) + iVar5),
         pGVar4 != (Gia_Obj_t *)0x0))) {
    *(ulong *)pGVar4 =
         *(ulong *)pGVar4 & 0xffffffffbfffffff | (ulong)((uint)*(undefined8 *)pGVar3 & 0x40000000);
    iVar5 = iVar5 + 1;
  }
  iVar5 = 0;
  do {
    if (vFirstTotal->nSize <= iVar5) {
      return iVar1;
    }
    uVar2 = Vec_IntEntry(vFirstTotal,iVar5);
    Entry = 0xffffffffffffffff;
    if (uVar2 != 0) {
      if (pAbs->vCis->nSize <= (int)uVar2 >> 10) {
        __assert_fail("First < Gia_ManCiNum(pAbs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                      ,0x2e4,
                      "int Wlc_NtkCexResim(Gia_Man_t *, Abc_Cex_t *, Vec_Int_t *, int, Vec_Wrd_t *, int)"
                     );
      }
      if (0x40 < (uVar2 & 0x3ff)) {
        __assert_fail("nBits <= 64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                      ,0x2e6,
                      "int Wlc_NtkCexResim(Gia_Man_t *, Abc_Cex_t *, Vec_Int_t *, int, Vec_Wrd_t *, int)"
                     );
      }
      Entry = 0;
      for (uVar6 = 0; (uVar2 & 0x3ff) != uVar6; uVar6 = uVar6 + 1) {
        pGVar3 = Gia_ManCi(pAbs,(int)uVar6 + ((int)uVar2 >> 10));
        Entry = Entry | 1L << ((byte)uVar6 & 0x3f) & (*(long *)pGVar3 << 0x21) >> 0x3f;
      }
    }
    Vec_WrdWriteEntry(vRes,vFirstTotal->nSize * iFrame + iVar5,Entry);
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

int Wlc_NtkCexResim( Gia_Man_t * pAbs, Abc_Cex_t * p, Vec_Int_t * vFirstTotal, int iBit, Vec_Wrd_t * vRes, int iFrame )
{
    Gia_Obj_t * pObj, * pObjRi, * pObjRo; 
    int k, b, Entry, First, nBits; word Value;
    // assuming that flop outputs have been assigned in the previous timeframe
    // assign primary inputs
    Gia_ManForEachPi( pAbs, pObj, k )
        pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
    // simulate
    Gia_ManForEachAnd( pAbs, pObj, k )
        pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                       (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
    // transfer to combinational outputs
    Gia_ManForEachCo( pAbs, pObj, k )
        pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
    // transfer values to flop outputs
    Gia_ManForEachRiRo( pAbs, pObjRi, pObjRo, k )
        pObjRo->fMark0 = pObjRi->fMark0;
    // at this point PIs and FOs area assigned according to this time-frame
    // collect values
    Vec_IntForEachEntry( vFirstTotal, Entry, k )
    {
        if ( Entry == 0 )
        {
            Vec_WrdWriteEntry( vRes, Vec_IntSize(vFirstTotal)*iFrame + k, ~(word)0 );
            continue;
        }
        First = Entry >> 10;
        assert( First < Gia_ManCiNum(pAbs) );
        nBits = Entry & 0x3FF;
        assert( nBits <= 64 );
        Value = 0;
        for ( b = 0; b < nBits; b++ )
            if ( Gia_ManCi(pAbs, First+b)->fMark0 )
                Value |= ((word)1) << b;
        Vec_WrdWriteEntry( vRes, Vec_IntSize(vFirstTotal)*iFrame + k, Value );
    }
    return iBit;
}